

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::ThingImpl::intercept(ThingImpl *this,InterceptContext context)

{
  long *in_RDX;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar1;
  Promise<void> PVar2;
  PointerBuilder local_98;
  StructBuilder local_78;
  undefined1 local_50;
  SegmentBuilder *local_38;
  CapTableBuilder *pCStack_30;
  WirePointer *local_28;
  
  local_50 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_38);
  local_98.pointer = local_28;
  local_98.segment = local_38;
  local_98.capTable = pCStack_30;
  PointerBuilder::getStruct(&local_78,&local_98,(StructSize)0x10000,(word *)0x0);
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  local_98.pointer = local_78.pointers;
  PointerBuilder::setBlob<capnp::Text>
            (&local_98,(StringPtr)*(StringPtr *)&context.hook[1]._vptr_CallContextHook);
  OVar1 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_78);
  PVar2.super_PromiseBase.node.ptr = OVar1.ptr;
  (this->super_Server)._vptr_Server = (_func_int **)local_78.segment;
  *(CapTableBuilder **)&(this->super_Server).field_0x8 = local_78.capTable;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> intercept(InterceptContext context) override {
    context.getResults().setText(text);
    return kj::READY_NOW;
  }